

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjDumpParser.cpp
# Opt level: O1

bool __thiscall ObjDumpParser::parseFunctionDecl(ObjDumpParser *this,char **data,size_t size)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *begin;
  char *pcVar4;
  
  pcVar4 = *data;
  uVar3 = strtoul(pcVar4,data,0x10);
  if (uVar3 != 0) {
    __s1 = *data;
    iVar2 = strncmp(__s1," <",2);
    if (iVar2 == 0) {
      pcVar4 = pcVar4 + (size - 2);
      *data = __s1 + 2;
      iVar2 = strncmp(pcVar4,">:",2);
      if (iVar2 == 0) {
        *pcVar4 = '\0';
        bVar1 = ScParser::parseFunctionDecl(this->m_scParser,data);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool ObjDumpParser::parseFunctionDecl(char *&data, std::size_t size)
{
    char *const endOfData = data + size - 2;

    if (!(expectAddress(data) && expectString(data, " <"))) {
        return false;
    }

    if (!eqString(endOfData, ">:")) {
        return false;
    }
    *endOfData = 0;

    return m_scParser.parseFunctionDecl(data);
}